

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O1

void __thiscall YAML::Stream::Stream(Stream *this,istream *input)

{
  long lVar1;
  byte bVar2;
  _Map_pointer ppcVar3;
  int iVar4;
  CharacterSet CVar5;
  uchar *puVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int *piVar11;
  int_type intro [4];
  undefined8 local_50;
  int local_48 [6];
  
  this->m_input = input;
  local_50 = &this->m_readahead;
  (this->m_mark).pos = 0;
  (this->m_mark).line = 0;
  *(undefined8 *)&(this->m_mark).column = 0;
  (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_map = (_Map_pointer)0x0;
  (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<char,_std::allocator<char>_>::_M_initialize_map
            (&local_50->super__Deque_base<char,_std::allocator<char>_>,0);
  puVar6 = (uchar *)operator_new__(0x800);
  this->m_pPrefetched = puVar6;
  this->m_nPrefetchedAvailable = 0;
  this->m_nPrefetchedUsed = 0;
  if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 5) == 0) {
    local_48[0] = 0;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    uVar10 = 0;
    iVar8 = 0;
    do {
      iVar4 = std::istream::get();
      local_48[iVar8] = iVar4;
      if (iVar4 < 0xbf) {
        if (iVar4 == -1) {
          lVar7 = 7;
        }
        else if (iVar4 == 0) {
          lVar7 = 0;
        }
        else {
          if (iVar4 != 0xbb) goto LAB_00729344;
          lVar7 = 1;
        }
      }
      else if (iVar4 < 0xfe) {
        if (iVar4 == 0xbf) {
          lVar7 = 2;
        }
        else if (iVar4 == 0xef) {
          lVar7 = 3;
        }
        else {
LAB_00729344:
          lVar7 = 7 - (ulong)(iVar4 - 1U < 0xfe);
        }
      }
      else if (iVar4 == 0xfe) {
        lVar7 = 4;
      }
      else {
        if (iVar4 != 0xff) goto LAB_00729344;
        lVar7 = 5;
      }
      iVar8 = iVar8 + 1;
      lVar1 = uVar10 * 8;
      uVar9 = (&s_introTransitions)[uVar10 * 8 + lVar7];
      uVar10 = (ulong)uVar9;
      bVar2 = (&s_introUngetCount)[lVar7 + lVar1];
      if ('\0' < (char)bVar2) {
        std::ios::clear((int)*(undefined8 *)(*(long *)input + -0x18) + (int)input);
        piVar11 = (int *)((long)&local_50 + (long)iVar8 * 4 + 4);
        iVar4 = bVar2 + 1;
        do {
          if (*piVar11 != -1) {
            std::istream::putback((char)input);
          }
          iVar8 = iVar8 + -1;
          piVar11 = piVar11 + -1;
          iVar4 = iVar4 + -1;
        } while (1 < iVar4);
      }
    } while (s_introFinalState[uVar10] != '\x01');
    uVar9 = uVar9 - 4;
    CVar5 = utf8;
    if (uVar9 < 8) {
      CVar5 = *(CharacterSet *)(&DAT_0076bdc0 + (ulong)uVar9 * 4);
    }
    this->m_charSet = CVar5;
    ppcVar3 = (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    if ((this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
        super__Deque_impl_data._M_start._M_last +
        (long)((this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur +
              (((((ulong)((long)ppcVar3 -
                         (long)(this->m_readahead).super__Deque_base<char,_std::allocator<char>_>.
                               _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(ppcVar3 == (_Map_pointer)0x0)) * 0x200 -
              (long)(this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first)) ==
        (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      _ReadAheadTo(this,0);
    }
  }
  return;
}

Assistant:

Stream::Stream(std::istream& input)
    : m_input(input),
      m_mark{},
      m_charSet{},
      m_readahead{},
      m_pPrefetched(new unsigned char[YAML_PREFETCH_SIZE]),
      m_nPrefetchedAvailable(0),
      m_nPrefetchedUsed(0) {
  using char_traits = std::istream::traits_type;

  if (!input)
    return;

  // Determine (or guess) the character-set by reading the BOM, if any.  See
  // the YAML specification for the determination algorithm.
  char_traits::int_type intro[4]{};
  int nIntroUsed = 0;
  UtfIntroState state = uis_start;
  for (; !s_introFinalState[state];) {
    std::istream::int_type ch = input.get();
    intro[nIntroUsed++] = ch;
    UtfIntroCharType charType = IntroCharTypeOf(ch);
    UtfIntroState newState = s_introTransitions[state][charType];
    int nUngets = s_introUngetCount[state][charType];
    if (nUngets > 0) {
      input.clear();
      for (; nUngets > 0; --nUngets) {
        if (char_traits::eof() != intro[--nIntroUsed])
          input.putback(char_traits::to_char_type(intro[nIntroUsed]));
      }
    }
    state = newState;
  }

  switch (state) {
    case uis_utf8:
      m_charSet = utf8;
      break;
    case uis_utf16le:
      m_charSet = utf16le;
      break;
    case uis_utf16be:
      m_charSet = utf16be;
      break;
    case uis_utf32le:
      m_charSet = utf32le;
      break;
    case uis_utf32be:
      m_charSet = utf32be;
      break;
    default:
      m_charSet = utf8;
      break;
  }

  ReadAheadTo(0);
}